

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printUsage(string *exec)

{
  ostream *poVar1;
  string filename;
  char local_29;
  long *local_28;
  long local_20;
  long local_18 [2];
  
  std::__cxx11::string::find_last_of((char *)exec,0x11f0b8,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_28,(ulong)exec);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_28,local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," input_file [options]",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_29 = '\t';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-j, --json filepath",0x13);
  local_29 = '\t';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_29,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"output ast to json in filepath",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_29 = '\t';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-d, --dot filepath",0x12);
  local_29 = '\t';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_29,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"output ast to dot in filepath",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  return;
}

Assistant:

void printUsage(std::string exec) {
	std::string filename = exec.substr(exec.find_last_of("/\\") + 1);
	std::cout <<   "Usage: " << filename << " input_file [options]" << std::endl;
	std::cout << '\t' << "-j, --json filepath" << '\t' << "output ast to json in filepath" << std::endl;
	std::cout << '\t' << "-d, --dot filepath" << '\t' << "output ast to dot in filepath" << std::endl;
}